

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O0

void os_routing_linux_interrupt(os_route *route)

{
  _Bool _Var1;
  os_route *route_local;
  
  _Var1 = os_routing_linux_is_in_progress(route);
  if (_Var1) {
    _routing_finished(route,-1);
  }
  return;
}

Assistant:

void
os_routing_linux_interrupt(struct os_route *route) {
  if (os_routing_linux_is_in_progress(route)) {
    _routing_finished(route, -1);
  }
}